

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O0

bool __thiscall
gl3cts::ClipDistance::CoverageTest::MaxClipDistancesValueInVertexShaderTest
          (CoverageTest *this,Functions *gl)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  allocator<int> *this_01;
  GLchar *pGVar1;
  undefined8 uVar2;
  LinkageStatus *pLVar3;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  CompilationStatus *pCVar6;
  size_type sVar7;
  reference pvVar8;
  MessageBuilder local_660;
  MessageBuilder local_4e0;
  undefined1 local_360 [8];
  vector<int,_std::allocator<int>_> results;
  vector<int,_std::allocator<int>_> local_340;
  undefined1 local_328 [8];
  VertexBufferObject<int> vertex_buffer_object;
  VertexArrayObject vertex_array_object;
  MessageBuilder local_2e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_160;
  undefined1 local_148 [8];
  Program program;
  undefined1 local_c0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  transform_feedback_varyings;
  undefined1 local_a0 [8];
  string transform_feedback_varying_name;
  undefined1 local_78 [8];
  string fragment_shader;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string vertex_shader;
  Functions *gl_local;
  CoverageTest *this_local;
  
  pGVar1 = m_vertex_shader_code_case_0;
  vertex_shader.field_2._8_8_ = gl;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,pGVar1,&local_41);
  std::allocator<char>::~allocator(&local_41);
  pGVar1 = m_fragment_shader_code_case_0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,pGVar1,
             (allocator<char> *)(transform_feedback_varying_name.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(transform_feedback_varying_name.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,"max_value",
             (allocator<char> *)
             ((long)&transform_feedback_varyings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&transform_feedback_varyings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  this_00 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&program.m_gl + 7);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this_00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_c0,1,(value_type *)local_a0,this_00);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&program.m_gl + 7));
  uVar2 = vertex_shader.field_2._8_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_160,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_c0);
  Utility::Program::Program
            ((Program *)local_148,(Functions *)uVar2,(string *)local_40,(string *)local_78,
             &local_160);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_160);
  pLVar3 = Utility::Program::ProgramStatus((Program *)local_148);
  if (pLVar3->program_id == 0) {
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_2e0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (&local_2e0,(char (*) [42])"Program failed to build.\n Vertex Shader:\n");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&m_vertex_shader_code_case_0);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,(char (*) [33])"\nVertex Shader compilation log:\n");
    pCVar6 = Utility::Program::VertexShaderStatus((Program *)local_148);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&pCVar6->shader_log);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [24])"\nWith Fragment Shader:\n");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&m_fragment_shader_code_case_0);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,(char (*) [40])"\nWith Fragment Shader compilation log:\n");
    pCVar6 = Utility::Program::FragmentShaderStatus((Program *)local_148);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&pCVar6->shader_log);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [28])"\nWith Program linkage log:\n");
    pCVar6 = Utility::Program::FragmentShaderStatus((Program *)local_148);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&pCVar6->shader_log);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b9e07b);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_2e0);
    this_local._7_1_ = false;
  }
  else {
    Utility::Program::UseProgram((Program *)local_148);
    Utility::VertexArrayObject::VertexArrayObject
              ((VertexArrayObject *)
               &vertex_buffer_object.m_enabled_arrays.super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (Functions *)vertex_shader.field_2._8_8_,0);
    uVar2 = vertex_shader.field_2._8_8_;
    results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 0;
    this_01 = (allocator<int> *)
              ((long)&results.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 3);
    std::allocator<int>::allocator(this_01);
    std::vector<int,_std::allocator<int>_>::vector
              (&local_340,1,
               (value_type_conflict1 *)
               ((long)&results.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4),this_01);
    Utility::VertexBufferObject<int>::VertexBufferObject
              ((VertexBufferObject<int> *)local_328,(Functions *)uVar2,0x8c8e,&local_340);
    std::vector<int,_std::allocator<int>_>::~vector(&local_340);
    std::allocator<int>::~allocator
              ((allocator<int> *)
               ((long)&results.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 3));
    Utility::VertexArrayObject::drawWithTransformFeedback
              ((VertexArrayObject *)
               &vertex_buffer_object.m_enabled_arrays.super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,0,1,true);
    Utility::VertexBufferObject<int>::readBuffer
              ((vector<int,_std::allocator<int>_> *)local_360,(VertexBufferObject<int> *)local_328);
    sVar7 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_360);
    if (sVar7 == 0) {
      pTVar4 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_4e0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<(&local_4e0,(char (*) [23])"Results reading error.");
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_4e0);
      this_local._7_1_ = false;
    }
    else {
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_360,0);
      if (*pvVar8 == this->m_gl_max_clip_distances_value) {
        this_local._7_1_ = true;
      }
      else {
        pTVar4 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_660,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (&local_660,
                            (char (*) [74])
                            "Vertex shader\'s gl_MaxClipDistances constant has improper value equal to "
                           );
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_360,0);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,pvVar8);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [5])0x2a796f1);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&this->m_gl_max_clip_distances_value);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [26])"is expected. Test failed.");
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_660);
        this_local._7_1_ = false;
      }
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_360);
    Utility::VertexBufferObject<int>::~VertexBufferObject((VertexBufferObject<int> *)local_328);
    Utility::VertexArrayObject::~VertexArrayObject
              ((VertexArrayObject *)
               &vertex_buffer_object.m_enabled_arrays.super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  Utility::Program::~Program((Program *)local_148);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_c0);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)local_40);
  return this_local._7_1_;
}

Assistant:

bool gl3cts::ClipDistance::CoverageTest::MaxClipDistancesValueInVertexShaderTest(const glw::Functions& gl)
{
	/*  Make a program that consist of vertex and fragment shader stages. A
	 vertex shader shall assign the value of gl_MaxClipDistances to transform
	 feedback output variable. Setup gl_Position with passed in attribute.
	 Use blank fragment shader. Check that the shaders compiles and links
	 successfully. Draw a single GL_POINT with screen centered position
	 attribute, a configured transform feedback and GL_RASTERIZER_DISCARD.
	 Query transform feedback value and compare it against
	 GL_MAX_CLIP_DISTANCES. Expect that both values are equal. */

	/* Building program. */
	const std::string vertex_shader					  = m_vertex_shader_code_case_0;
	const std::string fragment_shader				  = m_fragment_shader_code_case_0;
	std::string		  transform_feedback_varying_name = "max_value";

	std::vector<std::string> transform_feedback_varyings(1, transform_feedback_varying_name);

	gl3cts::ClipDistance::Utility::Program program(gl, vertex_shader, fragment_shader, transform_feedback_varyings);

	if (program.ProgramStatus().program_id == 0)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Program failed to build.\n Vertex Shader:\n"
						   << m_vertex_shader_code_case_0 << "\nVertex Shader compilation log:\n"
						   << program.VertexShaderStatus().shader_log << "\nWith Fragment Shader:\n"
						   << m_fragment_shader_code_case_0 << "\nWith Fragment Shader compilation log:\n"
						   << program.FragmentShaderStatus().shader_log << "\nWith Program linkage log:\n"
						   << program.FragmentShaderStatus().shader_log << "\n"
						   << tcu::TestLog::EndMessage;
		return false;
	}

	program.UseProgram();

	/* Creating and binding empty VAO. */
	gl3cts::ClipDistance::Utility::VertexArrayObject vertex_array_object(gl, GL_POINTS);

	/* Creating and binding output VBO */
	gl3cts::ClipDistance::Utility::VertexBufferObject<glw::GLint> vertex_buffer_object(gl, GL_TRANSFORM_FEEDBACK_BUFFER,
																					   std::vector<glw::GLint>(1, 0));

	/* Draw test. */
	vertex_array_object.drawWithTransformFeedback(0, 1, true);

	/* Check results. */
	std::vector<glw::GLint> results = vertex_buffer_object.readBuffer();

	if (results.size() < 1)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Results reading error." << tcu::TestLog::EndMessage;
		return false;
	}

	if (results[0] != m_gl_max_clip_distances_value)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Vertex shader's gl_MaxClipDistances constant has improper value equal to " << results[0]
						   << "but " << m_gl_max_clip_distances_value << "is expected. Test failed."
						   << tcu::TestLog::EndMessage;
		return false;
	}

	/* Test passed. */
	return true;
}